

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::String>_conflict * __thiscall
kj::ArrayBuilder<kj::String>::operator=
          (ArrayBuilder<kj::String> *this,ArrayBuilder<kj::String>_conflict *other)

{
  ArrayBuilder<kj::String>_conflict *other_local;
  ArrayBuilder<kj::String>_conflict *this_local;
  
  dispose(this);
  this->ptr = (String *)other->ptr;
  this->pos = (RemoveConst<kj::String> *)other->pos;
  this->endPtr = (String *)other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (char (*) [7])0x0;
  other->pos = (RemoveConst<kj::String>_conflict *)0x0;
  other->endPtr = (char (*) [7])0x0;
  return (ArrayBuilder<kj::String>_conflict *)this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }